

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O0

int compute_all_adcq(uint64_t dst,uint64_t src1,uint64_t src3)

{
  byte bVar1;
  ulong uVar2;
  target_long tVar3;
  target_long tVar4;
  bool bVar5;
  uint64_t src2;
  int of;
  int sf;
  int zf;
  int af;
  int pf;
  int cf;
  uint64_t src3_local;
  uint64_t src1_local;
  uint64_t dst_local;
  
  uVar2 = (dst - src1) - src3;
  if (src3 == 0) {
    bVar5 = dst < src1;
  }
  else {
    bVar5 = dst <= src1;
  }
  bVar1 = "\x04"[dst & 0xff];
  tVar3 = lshift(dst,-0x38);
  tVar4 = lshift((src1 ^ uVar2 ^ 0xffffffffffffffff) & (src1 ^ dst),-0x34);
  return (uint)(bVar5 | bVar1) | ((uint)dst ^ (uint)src1 ^ (uint)uVar2) & 0x10 |
         (uint)(dst == 0) << 6 | (uint)tVar3 & 0x80 | (uint)tVar4 & 0x800;
}

Assistant:

static int glue(compute_all_adc, SUFFIX)(DATA_TYPE dst, DATA_TYPE src1,
                                         DATA_TYPE src3)
{
    int cf, pf, af, zf, sf, of;
    DATA_TYPE src2 = dst - src1 - src3;

    cf = (src3 ? dst <= src1 : dst < src1);
    pf = parity_table[(uint8_t)dst];
    af = (dst ^ src1 ^ src2) & 0x10;
    zf = (dst == 0) << 6;
    sf = lshift(dst, 8 - DATA_BITS) & 0x80;
    of = lshift((src1 ^ src2 ^ -1) & (src1 ^ dst), 12 - DATA_BITS) & CC_O;
    return cf | pf | af | zf | sf | of;
}